

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_reorder.cpp
# Opt level: O0

LOs __thiscall
Omega_h::ent_order_from_vert_order(Omega_h *this,Mesh *mesh,Int ent_dim,LOs *new_verts2old_verts)

{
  LO LVar1;
  int iVar2;
  void *extraout_RDX;
  LOs LVar3;
  Graph local_168;
  Read<int> local_148;
  undefined1 local_138 [8];
  Graph new_verts2old_ents;
  undefined1 local_108 [8];
  Graph old_verts2old_ents;
  LOs *new_verts2old_verts_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  LOs *new_ents2old_ents;
  ulong local_60;
  ulong local_50;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(new_verts2old_verts->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((new_verts2old_verts->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(new_verts2old_verts->write_).shared_alloc_.alloc >> 3;
  }
  old_verts2old_ents.ab2b.write_.shared_alloc_.direct_ptr = new_verts2old_verts;
  LVar1 = Mesh::nverts(mesh);
  if ((int)(local_10 >> 2) != LVar1) {
    fail("assertion %s failed at %s +%d\n","new_verts2old_verts.size() == mesh->nverts()",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x1d);
  }
  find_entities_of_first_vertices((Graph *)local_108,mesh,ent_dim);
  if (((ulong)local_108 & 1) == 0) {
    local_20 = *(size_t *)local_108;
  }
  else {
    local_20 = (ulong)local_108 >> 3;
  }
  LVar1 = Mesh::nverts(mesh);
  if ((int)(local_20 >> 2) != LVar1 + 1) {
    fail("assertion %s failed at %s +%d\n","old_verts2old_ents.a2ab.size() == mesh->nverts() + 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x1f);
  }
  iVar2 = Read<int>::last((Read<int> *)local_108);
  LVar1 = Mesh::nents(mesh,ent_dim);
  if (iVar2 != LVar1) {
    fail("assertion %s failed at %s +%d\n","old_verts2old_ents.a2ab.last() == mesh->nents(ent_dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x20);
  }
  if (((ulong)old_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_30 = *old_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_30 = (ulong)old_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr >> 3;
  }
  LVar1 = Mesh::nents(mesh,ent_dim);
  if ((int)(local_30 >> 2) != LVar1) {
    fail("assertion %s failed at %s +%d\n","old_verts2old_ents.ab2b.size() == mesh->nents(ent_dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x21);
  }
  Read<int>::Read(&local_148,new_verts2old_verts);
  Graph::Graph(&local_168,(Graph *)local_108);
  unmap_graph((Graph *)local_138,&local_148,&local_168);
  Graph::~Graph(&local_168);
  Read<int>::~Read(&local_148);
  if (((ulong)local_138 & 1) == 0) {
    local_40 = *(size_t *)local_138;
  }
  else {
    local_40 = (ulong)local_138 >> 3;
  }
  LVar1 = Mesh::nverts(mesh);
  if ((int)(local_40 >> 2) != LVar1 + 1) {
    fail("assertion %s failed at %s +%d\n","new_verts2old_ents.a2ab.size() == mesh->nverts() + 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x24);
  }
  iVar2 = Read<int>::last((Read<int> *)local_138);
  LVar1 = Mesh::nents(mesh,ent_dim);
  if (iVar2 != LVar1) {
    fail("assertion %s failed at %s +%d\n","new_verts2old_ents.a2ab.last() == mesh->nents(ent_dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x25);
  }
  if (((ulong)new_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr & 1) == 0) {
    local_50 = *new_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr;
  }
  else {
    local_50 = (ulong)new_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr >> 3;
  }
  LVar1 = Mesh::nents(mesh,ent_dim);
  if ((int)(local_50 >> 2) != LVar1) {
    fail("assertion %s failed at %s +%d\n","new_verts2old_ents.ab2b.size() == mesh->nents(ent_dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x26);
  }
  Read<int>::Read((Read<int> *)this,
                  (Read<int> *)&new_verts2old_ents.a2ab.write_.shared_alloc_.direct_ptr);
  if ((*(ulong *)this & 1) == 0) {
    local_60 = **(ulong **)this;
  }
  else {
    local_60 = *(ulong *)this >> 3;
  }
  LVar1 = Mesh::nents(mesh,ent_dim);
  if ((int)(local_60 >> 2) != LVar1) {
    fail("assertion %s failed at %s +%d\n","new_ents2old_ents.size() == mesh->nents(ent_dim)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_reorder.cpp"
         ,0x28);
  }
  Graph::~Graph((Graph *)local_138);
  Graph::~Graph((Graph *)local_108);
  LVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  LVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (LOs)LVar3.write_.shared_alloc_;
}

Assistant:

static LOs ent_order_from_vert_order(
    Mesh* mesh, Int ent_dim, LOs new_verts2old_verts) {
  OMEGA_H_CHECK(new_verts2old_verts.size() == mesh->nverts());
  auto old_verts2old_ents = find_entities_of_first_vertices(mesh, ent_dim);
  OMEGA_H_CHECK(old_verts2old_ents.a2ab.size() == mesh->nverts() + 1);
  OMEGA_H_CHECK(old_verts2old_ents.a2ab.last() == mesh->nents(ent_dim));
  OMEGA_H_CHECK(old_verts2old_ents.ab2b.size() == mesh->nents(ent_dim));
  auto new_verts2old_ents =
      unmap_graph(new_verts2old_verts, old_verts2old_ents);
  OMEGA_H_CHECK(new_verts2old_ents.a2ab.size() == mesh->nverts() + 1);
  OMEGA_H_CHECK(new_verts2old_ents.a2ab.last() == mesh->nents(ent_dim));
  OMEGA_H_CHECK(new_verts2old_ents.ab2b.size() == mesh->nents(ent_dim));
  auto new_ents2old_ents = new_verts2old_ents.ab2b;
  OMEGA_H_CHECK(new_ents2old_ents.size() == mesh->nents(ent_dim));
  return new_ents2old_ents;
}